

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O2

void __thiscall
LASwriteItemCompressed_POINT14_v4::write_gps_time
          (LASwriteItemCompressed_POINT14_v4 *this,U64I64F64 gps_time)

{
  U8 *pUVar1;
  ulong uVar2;
  U32 UVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  I32 IVar8;
  ArithmeticModel *pAVar9;
  ArithmeticEncoder *this_00;
  IntegerCompressor *this_01;
  int real;
  int iVar10;
  long lVar11;
  float fVar12;
  
  uVar2 = (ulong)this->current_context;
  do {
    uVar7 = this->contexts[uVar2].last;
    lVar11 = gps_time.u64 - this->contexts[uVar2].last_gpstime[uVar7].u64;
    iVar4 = this->contexts[uVar2].last_gpstime_diff[uVar7];
    real = (int)lVar11;
    IVar8 = (I32)((ulong)gps_time >> 0x20);
    iVar10 = 1;
    if (iVar4 == 0) {
      if (lVar11 + 0x80000000U >> 0x20 == 0) {
        ArithmeticEncoder::encodeSymbol(this->enc_gps_time,this->contexts[uVar2].m_gpstime_0diff,0);
        IntegerCompressor::compress(this->contexts[this->current_context].ic_gpstime,0,real,0);
        uVar2 = (ulong)this->current_context;
        uVar7 = this->contexts[uVar2].last;
LAB_0013b48c:
        uVar6 = (ulong)uVar7;
        this->contexts[uVar2].last_gpstime_diff[uVar6] = (I32)lVar11;
        this->contexts[uVar2].multi_extreme_counter[uVar6] = 0;
        pUVar1 = this->contexts[uVar2].last_item + uVar6 * 8 + -1;
        goto LAB_0013b4b2;
      }
      iVar4 = -2;
      while( true ) {
        if (iVar4 == -5) {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[uVar2].m_gpstime_0diff,1);
          uVar7 = this->current_context;
          IntegerCompressor::compress
                    (this->contexts[uVar7].ic_gpstime,
                     *(I32 *)((long)this->contexts[uVar7].last_gpstime +
                             (ulong)this->contexts[uVar7].last * 8 + 4),IVar8,8);
          ArithmeticEncoder::writeInt(this->enc_gps_time,(U32)gps_time.u64);
          uVar2 = (ulong)this->current_context;
          uVar7 = this->contexts[uVar2].next + 1 & 3;
          this->contexts[uVar2].next = uVar7;
          this->contexts[uVar2].last = uVar7;
          lVar11 = 0;
          goto LAB_0013b48c;
        }
        if (0xfffffffeffffffff <
            (gps_time.u64 - 0x80000000) - this->contexts[uVar2].last_gpstime[uVar7 + iVar10 & 3].u64
           ) break;
        iVar10 = iVar10 + 1;
        iVar4 = iVar4 + -1;
      }
      this_00 = this->enc_gps_time;
      pAVar9 = this->contexts[uVar2].m_gpstime_0diff;
    }
    else {
      if (lVar11 + 0x80000000U >> 0x20 == 0) {
        fVar12 = (float)real / (float)iVar4;
        uVar7 = (uint)((double)fVar12 + *(double *)(&DAT_0014c818 + (ulong)(fVar12 < 0.0) * 8));
        if (uVar7 == 1) {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[uVar2].m_gpstime_multi,1);
          uVar7 = this->current_context;
          IntegerCompressor::compress
                    (this->contexts[uVar7].ic_gpstime,
                     this->contexts[uVar7].last_gpstime_diff[this->contexts[uVar7].last],real,1);
          this->contexts[this->current_context].multi_extreme_counter
          [this->contexts[this->current_context].last] = 0;
          goto LAB_0013b3d1;
        }
        if ((int)uVar7 < 1) {
          if ((int)uVar7 < 0) {
            pAVar9 = this->contexts[uVar2].m_gpstime_multi;
            if (0xfffffff6 < uVar7) {
              ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar9,500 - uVar7);
              uVar5 = this->current_context;
              IntegerCompressor::compress
                        (this->contexts[uVar5].ic_gpstime,
                         uVar7 * this->contexts[uVar5].last_gpstime_diff[this->contexts[uVar5].last]
                         ,real,5);
              goto LAB_0013b3d1;
            }
            ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar9,0x1fe);
            uVar7 = this->current_context;
            this_01 = this->contexts[uVar7].ic_gpstime;
            IVar8 = this->contexts[uVar7].last_gpstime_diff[this->contexts[uVar7].last] * -10;
            UVar3 = 6;
          }
          else {
            ArithmeticEncoder::encodeSymbol
                      (this->enc_gps_time,this->contexts[uVar2].m_gpstime_multi,0);
            this_01 = this->contexts[this->current_context].ic_gpstime;
            UVar3 = 7;
            IVar8 = 0;
          }
        }
        else {
          pAVar9 = this->contexts[uVar2].m_gpstime_multi;
          if (uVar7 < 500) {
            ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar9,uVar7);
            uVar5 = this->current_context;
            if (uVar7 < 10) {
              UVar3 = 2;
            }
            else {
              UVar3 = 3;
            }
            IntegerCompressor::compress
                      (this->contexts[uVar5].ic_gpstime,
                       this->contexts[uVar5].last_gpstime_diff[this->contexts[uVar5].last] * uVar7,
                       real,UVar3);
            goto LAB_0013b3d1;
          }
          ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar9,500);
          uVar7 = this->current_context;
          this_01 = this->contexts[uVar7].ic_gpstime;
          IVar8 = this->contexts[uVar7].last_gpstime_diff[this->contexts[uVar7].last] * 500;
          UVar3 = 4;
        }
        IntegerCompressor::compress(this_01,IVar8,real,UVar3);
        uVar7 = this->current_context;
        uVar5 = this->contexts[uVar7].last;
        iVar4 = this->contexts[uVar7].multi_extreme_counter[uVar5];
        this->contexts[uVar7].multi_extreme_counter[uVar5] = iVar4 + 1;
        if (2 < iVar4) {
          this->contexts[uVar7].last_gpstime_diff[uVar5] = real;
          this->contexts[uVar7].multi_extreme_counter[uVar5] = 0;
        }
LAB_0013b3d1:
        pUVar1 = this->contexts[this->current_context].last_item +
                 (ulong)this->contexts[this->current_context].last * 8 + -1;
LAB_0013b4b2:
        *(U64I64F64 *)(pUVar1 + 0xa80) = gps_time;
        return;
      }
      iVar4 = -0x200;
      while( true ) {
        if (iVar4 == -0x203) {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[uVar2].m_gpstime_multi,0x1ff);
          uVar7 = this->current_context;
          IntegerCompressor::compress
                    (this->contexts[uVar7].ic_gpstime,
                     *(I32 *)((long)this->contexts[uVar7].last_gpstime +
                             (ulong)this->contexts[uVar7].last * 8 + 4),IVar8,8);
          ArithmeticEncoder::writeInt(this->enc_gps_time,(U32)gps_time.u64);
          uVar7 = this->current_context;
          uVar5 = this->contexts[uVar7].next + 1 & 3;
          this->contexts[uVar7].next = uVar5;
          this->contexts[uVar7].last = uVar5;
          this->contexts[uVar7].last_gpstime_diff[uVar5] = 0;
          this->contexts[uVar7].multi_extreme_counter[uVar5] = 0;
          goto LAB_0013b3d1;
        }
        if (0xfffffffeffffffff <
            (gps_time.u64 - 0x80000000) - this->contexts[uVar2].last_gpstime[uVar7 + iVar10 & 3].u64
           ) break;
        iVar10 = iVar10 + 1;
        iVar4 = iVar4 + -1;
      }
      this_00 = this->enc_gps_time;
      pAVar9 = this->contexts[uVar2].m_gpstime_multi;
    }
    ArithmeticEncoder::encodeSymbol(this_00,pAVar9,-iVar4);
    uVar2 = (ulong)this->current_context;
    this->contexts[uVar2].last = iVar10 + this->contexts[uVar2].last & 3;
  } while( true );
}

Assistant:

void LASwriteItemCompressed_POINT14_v4::write_gps_time(const U64I64F64 gps_time)
{
  if (contexts[current_context].last_gpstime_diff[contexts[current_context].last] == 0) // if the last integer difference was zero
  {
    // calculate the difference between the two doubles as an integer
    I64 curr_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[contexts[current_context].last].i64;
    I32 curr_gpstime_diff = (I32)curr_gpstime_diff_64;
    if (curr_gpstime_diff_64 == (I64)(curr_gpstime_diff))
    {
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, 0); // the difference can be represented with 32 bits
      contexts[current_context].ic_gpstime->compress(0, curr_gpstime_diff, 0);
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    else // the difference is huge
    {
      U32 i;
      // maybe the double belongs to another time sequence
      for (i = 1; i < 4; i++)
      {
        I64 other_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[(contexts[current_context].last+i)&3].i64;
        I32 other_gpstime_diff = (I32)other_gpstime_diff_64;
        if (other_gpstime_diff_64 == (I64)(other_gpstime_diff))
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, i+1); // it belongs to another sequence 
          contexts[current_context].last = (contexts[current_context].last+i)&3;
          write_gps_time(gps_time);
          return;
        }
      }
      // no other sequence found. start new sequence.
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, 1); 
      contexts[current_context].ic_gpstime->compress((I32)(contexts[current_context].last_gpstime[contexts[current_context].last].u64 >> 32), (I32)(gps_time.u64 >> 32), 8);
      enc_gps_time->writeInt((U32)(gps_time.u64));
      contexts[current_context].next = (contexts[current_context].next+1)&3;
      contexts[current_context].last = contexts[current_context].next;
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = 0;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    contexts[current_context].last_gpstime[contexts[current_context].last].i64 = gps_time.i64;
  }
  else // the last integer difference was *not* zero
  {
    // calculate the difference between the two doubles as an integer
    I64 curr_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[contexts[current_context].last].i64;
    I32 curr_gpstime_diff = (I32)curr_gpstime_diff_64;

    // if the current gpstime difference can be represented with 32 bits
    if (curr_gpstime_diff_64 == (I64)(curr_gpstime_diff))
    {
      // compute multiplier between current and last integer difference
      F32 multi_f = (F32)curr_gpstime_diff / (F32)(contexts[current_context].last_gpstime_diff[contexts[current_context].last]);
      I32 multi = I32_QUANTIZE(multi_f);

      // compress the residual curr_gpstime_diff in dependance on the multiplier
      if (multi == 1)
      {
        // this is the case we assume we get most often for regular spaced pulses
        enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, 1);
        contexts[current_context].ic_gpstime->compress(contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 1);
        contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
      }
      else if (multi > 0)
      {
        if (multi < LASZIP_GPSTIME_MULTI) // positive multipliers up to LASZIP_GPSTIME_MULTI are compressed directly
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, multi);
          if (multi < 10)
            contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 2);
          else
            contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 3);
        }
        else
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI);
          contexts[current_context].ic_gpstime->compress(LASZIP_GPSTIME_MULTI*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 4);
          contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
          if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
          {
            contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
            contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
          }
        }
      }
      else if (multi < 0)
      {
        if (multi > LASZIP_GPSTIME_MULTI_MINUS) // negative multipliers larger than LASZIP_GPSTIME_MULTI_MINUS are compressed directly
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI - multi);
          contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 5);
        }
        else
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI - LASZIP_GPSTIME_MULTI_MINUS);
          contexts[current_context].ic_gpstime->compress(LASZIP_GPSTIME_MULTI_MINUS*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 6);
          contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
          if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
          {
            contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
            contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
          }
        }
      }
      else
      {
        enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, 0);
        contexts[current_context].ic_gpstime->compress(0, curr_gpstime_diff, 7);
        contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
        if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
        {
          contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
          contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
        }
      }
    }
    else // the difference is huge
    {
      U32 i;
      // maybe the double belongs to another time sequence
      for (i = 1; i < 4; i++)
      {
        I64 other_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[(contexts[current_context].last+i)&3].i64;
        I32 other_gpstime_diff = (I32)other_gpstime_diff_64;
        if (other_gpstime_diff_64 == (I64)(other_gpstime_diff))
        {
          // it belongs to this sequence 
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI_CODE_FULL+i);
          contexts[current_context].last = (contexts[current_context].last+i)&3;
          write_gps_time(gps_time);
          return;
        }
      }
      // no other sequence found. start new sequence.
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI_CODE_FULL);
      contexts[current_context].ic_gpstime->compress((I32)(contexts[current_context].last_gpstime[contexts[current_context].last].u64 >> 32), (I32)(gps_time.u64 >> 32), 8);
      enc_gps_time->writeInt((U32)(gps_time.u64));
      contexts[current_context].next = (contexts[current_context].next+1)&3;
      contexts[current_context].last = contexts[current_context].next;
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = 0;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    contexts[current_context].last_gpstime[contexts[current_context].last].i64 = gps_time.i64;
  }
}